

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O0

int CharacterDecodingHokuyo(char *buf,int buflen)

{
  uint local_1c;
  int local_18;
  int value;
  int i;
  int buflen_local;
  char *buf_local;
  
  local_1c = 0;
  for (local_18 = 0; local_18 < buflen; local_18 = local_18 + 1) {
    local_1c = (int)buf[local_18] - 0x30U | local_1c << 6;
  }
  return local_1c;
}

Assistant:

inline int CharacterDecodingHokuyo(char* buf, int buflen)
{
	int i = 0, value = 0;

	for (i = 0; i < buflen; i++)
	{
		value <<= 6;
		value &= ~0x3f;
		value |= buf[i] - 0x30;
	}

	return value;
}